

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInfo.Common.cpp
# Opt level: O2

bool PlatformAgnostic::SystemInfo::GetBinaryLocation(char *path,uint size)

{
  uint uVar1;
  ssize_t sVar2;
  ulong uVar3;
  
  sVar2 = readlink("/proc/self/exe",path,(ulong)(size - 1));
  uVar1 = (uint)sVar2;
  if ((int)uVar1 < 1) {
    builtin_strncpy(path,"GetBinaryLocation: /proc/self/exe has failed.",0x2d);
    uVar3 = 0x2d;
  }
  else {
    uVar3 = (ulong)(uVar1 & 0x7fffffff);
  }
  path[uVar3] = '\0';
  return 0 < (int)uVar1;
}

Assistant:

bool SystemInfo::GetBinaryLocation(char *path, const unsigned size)
    {
        // TODO: make AssertMsg available under PlatformAgnostic
        //AssertMsg(path != nullptr, "Path can not be nullptr");
        //AssertMsg(size < INT_MAX, "Isn't it too big for a path buffer?");
#ifdef __APPLE__
        uint32_t path_size = (uint32_t)size;
        char *tmp = nullptr;
        int str_len;
        if (_NSGetExecutablePath(path, &path_size))
        {
            SET_BINARY_PATH_ERROR_MESSAGE(path, "GetBinaryLocation: _NSGetExecutablePath has failed.");
            return false;
        }

        tmp = (char*)malloc(size);
        char *result = realpath(path, tmp);
        str_len = strlen(result);
        memcpy(path, result, str_len);
        free(tmp);
        path[str_len] = char(0);
        return true;
#elif defined(__linux__)
        int str_len = readlink("/proc/self/exe", path, size - 1);
        if (str_len <= 0)
        {
            SET_BINARY_PATH_ERROR_MESSAGE(path, "GetBinaryLocation: /proc/self/exe has failed.");
            return false;
        }
        path[str_len] = char(0);
        return true;
#else
        #warning "Implement GetBinaryLocation for this platform"
#endif
    }